

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# leave.hpp
# Opt level: O3

void __thiscall
soplex::SPxSolverBase<double>::computeDualfarkas4Col(SPxSolverBase<double> *this,double direction)

{
  double dVar1;
  int iVar2;
  Nonzero<double> *pNVar3;
  UpdateVector<double> *pUVar4;
  int iVar5;
  long lVar6;
  
  (this->dualFarkas).super_SVectorBase<double>.memused = 0;
  iVar5 = (this->theCoPvec->thedelta).super_IdxSet.num;
  if (iVar5 < 1) {
    iVar5 = 0;
  }
  spx_realloc<soplex::Nonzero<double>*>(&(this->dualFarkas).theelem,iVar5);
  pUVar4 = this->theCoPvec;
  (this->dualFarkas).super_SVectorBase<double>.m_elem = (this->dualFarkas).theelem;
  (this->dualFarkas).super_SVectorBase<double>.memsize = iVar5;
  (this->dualFarkas).super_SVectorBase<double>.memused = 0;
  if (0 < (pUVar4->thedelta).super_IdxSet.num) {
    lVar6 = 0;
    do {
      iVar5 = (pUVar4->thedelta).super_IdxSet.idx[lVar6];
      dVar1 = (pUVar4->thedelta).super_VectorBase<double>.val.
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_start[iVar5];
      DSVectorBase<double>::makeMem(&this->dualFarkas,1);
      if ((dVar1 != 0.0) || (NAN(dVar1))) {
        iVar2 = (this->dualFarkas).super_SVectorBase<double>.memused;
        pNVar3 = (this->dualFarkas).super_SVectorBase<double>.m_elem;
        pNVar3[iVar2].idx = iVar5;
        pNVar3[iVar2].val =
             (double)((ulong)-dVar1 & -(ulong)(0.0 < direction) |
                     ~-(ulong)(0.0 < direction) & (ulong)dVar1);
        (this->dualFarkas).super_SVectorBase<double>.memused = iVar2 + 1;
      }
      lVar6 = lVar6 + 1;
      pUVar4 = this->theCoPvec;
    } while (lVar6 < (pUVar4->thedelta).super_IdxSet.num);
  }
  return;
}

Assistant:

void SPxSolverBase<R>::computeDualfarkas4Col(R direction)
{
   R sign = (direction > 0 ? -1.0 : 1.0);

   dualFarkas.clear();
   dualFarkas.setMax(coPvec().delta().size());

   for(int i = 0; i < coPvec().delta().size(); ++i)
      dualFarkas.add(coPvec().delta().index(i), sign * coPvec().delta().value(i));
}